

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

bool IsCopyTypeInstr(Instr *instr)

{
  OpCode OVar1;
  bool bVar2;
  
  OVar1 = instr->m_opcode;
  bVar2 = true;
  if (((1 < OVar1 - 0x1e4) && (OVar1 != Ld_A)) && (OVar1 != LdFld)) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool IsCopyTypeInstr(IR::Instr *instr)
{
    switch (instr->m_opcode)
    {
    case Js::OpCode::LdC_A_I4:
    case Js::OpCode::Ld_I4:
    case Js::OpCode::Ld_A:
    case Js::OpCode::LdFld: return true;
    default:
        return false;
    }
}